

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLExtraDataLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::ExtraDataLoader::base__begin__technique
          (ExtraDataLoader *this,technique__AttributeData *attributeData,UniqueId *uniqueId,
          Object *object)

{
  long *plVar1;
  bool calling;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t index;
  long lVar4;
  StringHash elementHash;
  StringHash local_38;
  long lVar3;
  
  iVar2 = (*this->_vptr_ExtraDataLoader[2])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  lVar4 = *(long *)(lVar3 + 0x90) - *(long *)(lVar3 + 0x88);
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    index = 0;
    do {
      plVar1 = *(long **)(*(long *)(lVar3 + 0x88) + index * 8);
      iVar2 = (*this->_vptr_ExtraDataLoader[2])(this);
      local_38 = FileLoader::getElementHash((FileLoader *)CONCAT44(extraout_var_00,iVar2),1);
      calling = (bool)(**(code **)(*plVar1 + 0x28))
                                (plVar1,attributeData->profile,&local_38,uniqueId,object);
      ExtraDataElementHandler::setExtraDataCallbackHandlerCalling
                ((ExtraDataElementHandler *)(lVar3 + 0x80),index,calling);
      index = index + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != index);
  }
  return true;
}

Assistant:

bool ExtraDataLoader::base__begin__technique ( 
        const technique__AttributeData& attributeData, 
		const COLLADAFW::UniqueId& uniqueId,
		COLLADAFW::Object* object )
    {
        // Get the extra data element handler.
        ExtraDataElementHandler& extraDataElementHandler = getFileLoader ()->getExtraDataElementHandler ();

        // Ask all handlers, if they want to have the data of the current extra tag.
        // (profile name, element name ("optics"), id (cameraId)) 
        const ExtraDataCallbackHandlerList& extraDataCallbackHandlerList = extraDataElementHandler.getExtraDataCallbackHandlerList ();
        size_t numHandlers = extraDataCallbackHandlerList.size ();
        for ( size_t i=0; i<numHandlers; ++i )
        {
            IExtraDataCallbackHandler* extraDataCallbackHandler = extraDataCallbackHandlerList[i];

            // Get the hash value of the current element.
            size_t level = 1;
            StringHash elementHash = getFileLoader ()->getElementHash ( level );

            // Get the profile name.
            const ParserChar* profileName = attributeData.profile;

            // Ask, if the current handler should parse the extra tags of the current element.
            bool parseElement = extraDataCallbackHandler->parseElement ( profileName, elementHash, uniqueId, object );

            // Store the flag in the list.
            extraDataElementHandler.setExtraDataCallbackHandlerCalling ( i, parseElement );
        }
        return true;
    }